

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall Parameter<double>::setData(Parameter<double> *this,string *sval)

{
  bool bVar1;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Parameter<double> *unaff_retaddr;
  string local_30 [40];
  
  std::__cxx11::string::string(local_30,in_RSI);
  bVar1 = internalSetData<std::__cxx11::string>(unaff_retaddr,in_RDI);
  std::__cxx11::string::~string(local_30);
  return bVar1;
}

Assistant:

virtual bool setData(std::string sval) {
    return internalSetData<std::string>(sval);
  }